

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void SpawnShootDecal(AActor *t1,FTraceResults *trace)

{
  side_t *wall;
  F3DFloor *ffloor;
  int iVar1;
  AActor *pAVar2;
  undefined4 extraout_var;
  FDecalBase **pos;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_24;
  FDecalBase *local_20;
  FDecalBase *decalbase;
  FTraceResults *trace_local;
  AActor *t1_local;
  
  local_20 = (FDecalBase *)0x0;
  decalbase = (FDecalBase *)trace;
  trace_local = (FTraceResults *)t1;
  if ((t1->player == (player_t *)0x0) || (t1->player->ReadyWeapon == (AWeapon *)0x0)) {
    local_20 = t1->DecalGenerator;
  }
  else {
    pAVar2 = AActor::GetDefault((AActor *)t1->player->ReadyWeapon);
    local_20 = pAVar2->DecalGenerator;
  }
  if (local_20 != (FDecalBase *)0x0) {
    iVar1 = (**local_20->_vptr_FDecalBase)();
    pos = &decalbase->Right;
    wall = *(side_t **)
            (*(long *)&decalbase[2].Name + 0x48 + (ulong)*(byte *)&decalbase[2].Users.Array * 8);
    ffloor = *(F3DFloor **)&decalbase[2].Users.Most;
    PalEntry::PalEntry((PalEntry *)&local_24.field_0,0);
    DImpactDecal::StaticCreate
              ((FDecalTemplate *)CONCAT44(extraout_var,iVar1),(DVector3 *)pos,wall,ffloor,
               (PalEntry)local_24);
  }
  return;
}

Assistant:

void SpawnShootDecal(AActor *t1, const FTraceResults &trace)
{
	FDecalBase *decalbase = NULL;

	if (t1->player != NULL && t1->player->ReadyWeapon != NULL)
	{
		decalbase = t1->player->ReadyWeapon->GetDefault()->DecalGenerator;
	}
	else
	{
		decalbase = t1->DecalGenerator;
	}
	if (decalbase != NULL)
	{
		DImpactDecal::StaticCreate(decalbase->GetDecal(),
			trace.HitPos, trace.Line->sidedef[trace.Side], trace.ffloor);
	}
}